

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void gen_ldst_i32(TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,TCGv_i32 val,TCGv_i32 addr,MemOp memop
                 ,TCGArg idx)

{
  TCGMemOpIdx TVar1;
  TCGMemOpIdx oi;
  TCGArg idx_local;
  MemOp memop_local;
  TCGv_i32 addr_local;
  TCGv_i32 val_local;
  TCGOpcode opc_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  TVar1 = make_memop_idx(memop,(uint)idx);
  tcg_gen_op3i_i32(tcg_ctx,opc,val,addr,(ulong)TVar1);
  return;
}

Assistant:

static void gen_ldst_i32(TCGContext *tcg_ctx, TCGOpcode opc, TCGv_i32 val, TCGv addr,
                         MemOp memop, TCGArg idx)
{
    TCGMemOpIdx oi = make_memop_idx(memop, idx);
#if TARGET_LONG_BITS == 32
    tcg_gen_op3i_i32(tcg_ctx, opc, val, addr, oi);
#else
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_op4i_i32(tcg_ctx, opc, val, TCGV_LOW(tcg_ctx, addr), TCGV_HIGH(tcg_ctx, addr), oi);
#else
        tcg_gen_op3(tcg_ctx, opc, tcgv_i32_arg(tcg_ctx, val), tcgv_i64_arg(tcg_ctx, addr), oi);
#endif
#endif
}